

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnm.hpp
# Opt level: O0

void __thiscall baryonyx::pnm_array::operator()(pnm_array *this,string *filename)

{
  pointer puVar1;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view format_str;
  format_args args;
  undefined1 local_2ec [4];
  undefined1 local_2e8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> header;
  ofstream ofs;
  string *filename_local;
  pnm_array *this_local;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  local_b0;
  basic_string_view<char> local_a8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_unsigned_int,_const_unsigned_int,_int>
  local_98;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_unsigned_int,_const_unsigned_int,_int>
  *local_60;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_unsigned_int,_const_unsigned_int,_int>
  *vargs;
  uint *local_50;
  uint *local_48;
  char *local_40;
  undefined1 *local_38;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_unsigned_int,_const_unsigned_int,_int>
  *local_30;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_28;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_unsigned_int,_const_unsigned_int,_int>
  *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_unsigned_int,_const_unsigned_int,_int>
  *local_10;
  
  std::ofstream::ofstream((void *)((long)&header.field_2 + 8),(string *)filename,_S_bin);
  local_48 = &this->m_width;
  local_50 = &this->m_heigth;
  local_2ec = (undefined1  [4])0xff;
  local_38 = local_2e8;
  local_40 = "P6 {} {} {} ";
  vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_unsigned_int,_const_unsigned_int,_int>
           *)local_2ec;
  ::fmt::v7::make_args_checked<unsigned_int_const&,unsigned_int_const&,int,char[13],char>
            (&local_98,(v7 *)"P6 {} {} {} ",(char (*) [13])local_48,local_50,
             (remove_reference_t<const_unsigned_int_&> *)vargs,
             (remove_reference_t<int> *)in_R9.values_);
  local_60 = &local_98;
  local_a8 = ::fmt::v7::to_string_view<char,_0>(local_40);
  local_28 = (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
              *)&this_local;
  local_30 = local_60;
  local_20 = local_60;
  local_10 = local_60;
  local_18 = local_28;
  ::fmt::v7::
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>::
  basic_format_args(local_28,0x122,
                    (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                     *)local_60);
  format_str.size_ = (size_t)this_local;
  format_str.data_ = (char *)local_a8.size_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.values_ = in_R9.values_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)local_b0.values_;
  ::fmt::v7::detail::vformat_abi_cxx11_
            ((string *)local_2e8,(detail *)local_a8.data_,format_str,args);
  std::operator<<((ostream *)(header.field_2._M_local_buf + 8),(string *)local_2e8);
  puVar1 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                     (&this->m_buffer);
  size(this);
  std::ostream::write(header.field_2._M_local_buf + 8,(long)puVar1);
  std::__cxx11::string::~string((string *)local_2e8);
  std::ofstream::~ofstream((void *)((long)&header.field_2 + 8));
  return;
}

Assistant:

void operator()(std::string filename) const noexcept
    {
        std::ofstream ofs{ filename, std::ios::binary };
        auto header{ fmt::format("P6 {} {} {} ", m_width, m_heigth, 255) };

        ofs << header;
        ofs.write(reinterpret_cast<char*>(m_buffer.get()), size());
    }